

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O0

Allocation * __thiscall
density::detail::
LFQueue_Base<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
::try_inplace_allocate
          (Allocation *__return_storage_ptr__,
          LFQueue_Base<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
          *this,progress_guarantee i_progress_guarantee,uintptr_t i_control_bits,bool i_include_type
          ,size_t i_size,size_t i_alignment)

{
  size_t i_size_local;
  bool i_include_type_local;
  uintptr_t i_control_bits_local;
  progress_guarantee i_progress_guarantee_local;
  LFQueue_Base<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
  *this_local;
  
  if ((i_control_bits & 4) != 0) {
    density_tests::detail::assert_failed<>
              ("(i_control_bits & LfQueue_External) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_base.h"
               ,0x11a);
  }
  if (i_progress_guarantee != progress_blocking) {
    if (i_progress_guarantee - progress_obstruction_free < 2) {
      LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
      ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)2>
                (__return_storage_ptr__,
                 (LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                  *)this,i_control_bits,i_include_type,i_size,i_alignment);
      return __return_storage_ptr__;
    }
    if (i_progress_guarantee == progress_wait_free) {
      LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
      ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)3>
                (__return_storage_ptr__,
                 (LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                  *)this,i_control_bits,i_include_type,i_size,i_alignment);
      return __return_storage_ptr__;
    }
  }
  LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)1>
            (__return_storage_ptr__,
             (LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
              *)this,i_control_bits,i_include_type,i_size,i_alignment);
  return __return_storage_ptr__;
}

Assistant:

Allocation try_inplace_allocate(
              progress_guarantee i_progress_guarantee,
              uintptr_t          i_control_bits,
              bool               i_include_type,
              size_t             i_size,
              size_t             i_alignment) noexcept
            {
                DENSITY_ASSERT_INTERNAL(
                  (i_control_bits & LfQueue_External) == 0); /* External blocks are
                    decided by the tail layers. The upper layers shouldn't use this flag. */
                switch (i_progress_guarantee)
                {
                case progress_wait_free:
                    return static_cast<DERIVED *>(this)
                      ->template try_inplace_allocate_impl<detail::LfQueue_WaitFree>(
                        i_control_bits, i_include_type, i_size, i_alignment);

                case progress_lock_free:
                case progress_obstruction_free:
                    return static_cast<DERIVED *>(this)
                      ->template try_inplace_allocate_impl<detail::LfQueue_LockFree>(
                        i_control_bits, i_include_type, i_size, i_alignment);

                default:
                    DENSITY_ASSUME(false); // fall-through to progress_blocking to avoid 'not all
                                           // control paths return a value' warnings
                case progress_blocking:
                    return static_cast<DERIVED *>(this)
                      ->template try_inplace_allocate_impl<detail::LfQueue_Blocking>(
                        i_control_bits, i_include_type, i_size, i_alignment);
                }
            }